

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool duckdb_re2::re2_internal::Parse<float>(char *str,size_t n,float *dest)

{
  char *__nptr;
  int *piVar1;
  float fVar2;
  char *end;
  char buf [201];
  size_t local_108;
  char *local_100;
  char local_f8 [208];
  
  if (n != 0) {
    local_108 = n;
    __nptr = TerminateNumber(local_f8,0xc9,str,&local_108,true);
    piVar1 = __errno_location();
    *piVar1 = 0;
    fVar2 = strtof(__nptr,&local_100);
    if ((local_100 == __nptr + local_108) && (*piVar1 == 0)) {
      if (dest == (float *)0x0) {
        return true;
      }
      *dest = fVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Parse(const char* str, size_t n, float* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  float r = strtof(str, &end);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *dest = r;
  return true;
}